

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_schema.cpp
# Opt level: O0

bool duckdb::CSVSchema::CanWeCastIt(LogicalTypeId source,LogicalTypeId destination)

{
  bool local_14;
  bool local_13;
  bool local_12;
  bool local_11;
  LogicalTypeId destination_local;
  LogicalTypeId source_local;
  bool local_1;
  
  if ((destination == VARCHAR) || (source == destination)) {
    local_1 = true;
  }
  else {
    switch(source) {
    case SQLNULL:
      local_1 = true;
      break;
    default:
      local_1 = false;
      break;
    case TINYINT:
      local_11 = true;
      if (((destination != SMALLINT) && (local_11 = true, destination != INTEGER)) &&
         ((local_11 = true, destination != BIGINT &&
          ((local_11 = true, destination != DECIMAL && (local_11 = true, destination != FLOAT))))))
      {
        local_11 = destination == DOUBLE;
      }
      local_1 = local_11;
      break;
    case SMALLINT:
      local_12 = true;
      if (((destination != INTEGER) && (local_12 = true, destination != BIGINT)) &&
         ((local_12 = true, destination != DECIMAL && (local_12 = true, destination != FLOAT)))) {
        local_12 = destination == DOUBLE;
      }
      local_1 = local_12;
      break;
    case INTEGER:
      local_13 = true;
      if (((destination != BIGINT) && (local_13 = true, destination != DECIMAL)) &&
         (local_13 = true, destination != FLOAT)) {
        local_13 = destination == DOUBLE;
      }
      local_1 = local_13;
      break;
    case BIGINT:
      local_14 = true;
      if ((destination != DECIMAL) && (local_14 = true, destination != FLOAT)) {
        local_14 = destination == DOUBLE;
      }
      local_1 = local_14;
      break;
    case FLOAT:
      local_1 = destination == DOUBLE;
    }
  }
  return local_1;
}

Assistant:

bool CSVSchema::CanWeCastIt(LogicalTypeId source, LogicalTypeId destination) {
	if (destination == LogicalTypeId::VARCHAR || source == destination) {
		// We can always cast to varchar
		// And obviously don't have to do anything if they are equal.
		return true;
	}
	switch (source) {
	case LogicalTypeId::SQLNULL:
		return true;
	case LogicalTypeId::TINYINT:
		return destination == LogicalTypeId::SMALLINT || destination == LogicalTypeId::INTEGER ||
		       destination == LogicalTypeId::BIGINT || destination == LogicalTypeId::DECIMAL ||
		       destination == LogicalTypeId::FLOAT || destination == LogicalTypeId::DOUBLE;
	case LogicalTypeId::SMALLINT:
		return destination == LogicalTypeId::INTEGER || destination == LogicalTypeId::BIGINT ||
		       destination == LogicalTypeId::DECIMAL || destination == LogicalTypeId::FLOAT ||
		       destination == LogicalTypeId::DOUBLE;
	case LogicalTypeId::INTEGER:
		return destination == LogicalTypeId::BIGINT || destination == LogicalTypeId::DECIMAL ||
		       destination == LogicalTypeId::FLOAT || destination == LogicalTypeId::DOUBLE;
	case LogicalTypeId::BIGINT:
		return destination == LogicalTypeId::DECIMAL || destination == LogicalTypeId::FLOAT ||
		       destination == LogicalTypeId::DOUBLE;
	case LogicalTypeId::FLOAT:
		return destination == LogicalTypeId::DOUBLE;
	default:
		return false;
	}
}